

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operands.c
# Opt level: O1

int GetArgs(char *name)

{
  char cVar1;
  size_t sVar2;
  ushort **ppuVar3;
  long lVar4;
  ulong uVar5;
  char cVar6;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  char currarg [128];
  char local_b8 [136];
  
  sVar2 = strlen(name);
  iVar9 = (int)sVar2 + 1;
  Heap2Space(iVar9);
  strcpy(NextFNS,name);
  NextFNS = NextFNS + iVar9;
  if (High2 < NextFNS) {
    High2 = NextFNS;
  }
  lVar10 = (long)SrcLoc;
  ppuVar3 = __ctype_b_loc();
  lVar4 = (long)Line[lVar10];
  iVar9 = 0;
  if (((*ppuVar3)[lVar4] >> 0xd & 1) == 0) {
    pcVar11 = Line + lVar10;
    iVar9 = 0;
    do {
      cVar1 = (char)lVar4;
      if (cVar1 == '\0') {
        return iVar9;
      }
      if (((uint)lVar4 & 0xff) == 0x3b) {
        return iVar9;
      }
      uVar5 = (ulong)(cVar1 == '<');
      pcVar7 = pcVar11 + uVar5;
      cVar6 = pcVar11[uVar5];
      pcVar8 = pcVar7;
      pcVar12 = local_b8;
      if (cVar6 != '\0') {
        pcVar11 = pcVar11 + uVar5 + 1;
        pcVar12 = local_b8;
        do {
          if (cVar1 == '<') {
            pcVar8 = pcVar11;
            if (cVar6 == '>') goto LAB_0010938d;
          }
          else {
            pcVar8 = pcVar7;
            if (cVar6 == ',') goto LAB_0010938d;
            if ((cVar6 == ';') || (((*ppuVar3)[cVar6] & 0x2000) != 0)) break;
          }
          pcVar7 = pcVar7 + 1;
          *pcVar12 = cVar6;
          pcVar12 = pcVar12 + 1;
          cVar6 = *pcVar11;
          pcVar11 = pcVar11 + 1;
        } while (cVar6 != '\0');
        pcVar8 = pcVar11 + -1;
      }
LAB_0010938d:
      *pcVar12 = '\0';
      Heap2Space((int)(pcVar12 + (1 - (long)local_b8)));
      strcpy(NextFNS,local_b8);
      NextFNS = NextFNS + (long)(pcVar12 + (1 - (long)local_b8));
      if (High2 < NextFNS) {
        High2 = NextFNS;
      }
      iVar9 = iVar9 + 1;
      pcVar11 = pcVar8 + (*pcVar8 == ',');
      lVar4 = (long)pcVar8[*pcVar8 == ','];
    } while (((*ppuVar3)[lVar4] >> 0xd & 1) == 0);
  }
  return iVar9;
}

Assistant:

int 
GetArgs (char *name)
/* Gets macro arguments and adds them to FNStack after adding "name".
 Returns the number of arguments added to the stack.
 Note that this might not be the full number of arguments
 provided if the stack overflowed.				*/
{
	register char *s, *t;
	int narg, instring;
	char currarg[MAXLINE]; /* Current argument */

	narg = strlen(name) + 1;
	Heap2Space(narg); /* Find space for name. */
	strcpy(NextFNS, name); /* Add name to stack. */
	NextFNS += narg; /* Bump pointer. */
	if (NextFNS > High2)
		High2 = NextFNS; /* Update the high-water mark. */

	narg = 0; /* Argument counter */

	s = Line + SrcLoc; /* Now scan Line. */
	while (!isspace(*s) && (*s != ';') && (*s != '\0')) {
		t = currarg;
		if ((instring = (*s == '<'))) /* String delimiter */
			s++;
		//TODO: Maybe introduce a newinstring = (*s == '"') and go for it?
		while (1) {
			if (*s == '\0')
				break; /* End of line */
			if (instring) {
				if (*s == '>') {
					s++;
					break; /* End of string */
				}
			} else {
				if ((*s == ',') /* End of operand */
				|| isspace(*s) /* End of all operands */
				|| (*s == ';')) /* Start of comments */
					break;
			}
			*t++ = *s++; /* Get a character. */
		}
		*t++ = '\0';
		Heap2Space(t - currarg); /* Check for space. */
		strcpy(NextFNS, currarg); /* Store argument. */
		NextFNS += t - currarg; /* Next available space */
		if (NextFNS > High2)
			High2 = NextFNS; /* High-water mark */
		narg++; /* Count arguments. */
		if (*s == ',')
			s++; /* Skip over separator. */
	}
	return (narg); /* Successful completion */
}